

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  Table *pTVar1;
  AggInfo *pAVar2;
  u16 uVar3;
  undefined4 uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint destIfNull;
  uint uVar10;
  char *z2;
  Parse *pPVar11;
  char *pcVar12;
  FuncDef *pDef;
  ExprList_item *pEVar13;
  CollSeq *zP4;
  byte bVar14;
  char *pcVar15;
  Expr *pEVar16;
  long lVar17;
  Expr *pEVar18;
  Expr *pEVar19;
  ulong uVar20;
  ulong uVar21;
  Vdbe *pVVar22;
  bool bVar23;
  int regFree1;
  int regFree2;
  undefined8 local_108;
  Expr *local_100;
  Vdbe *local_f8;
  ulong local_f0;
  Expr *local_e8;
  sqlite3 *local_e0;
  ulong local_d8;
  Expr *local_d0;
  Expr opCompare;
  Expr cacheX;
  
  bVar14 = 0;
  pVVar22 = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (pVVar22 == (Vdbe *)0x0) {
    return 0;
  }
  if (pExpr == (Expr *)0x0) {
    uVar10 = 0x62;
  }
  else {
    uVar10 = (uint)pExpr->op;
  }
  iVar8 = target;
  iVar6 = target;
  iVar9 = target;
  local_f8 = pVVar22;
  switch(uVar10) {
  case 0x13:
  case 0x5d:
    iVar7 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    goto LAB_00194fca;
  case 0x14:
switchD_00194bde_caseD_14:
    iVar8 = sqlite3CodeSubselect(pParse,pExpr,0,0);
    break;
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x51:
  case 0x5f:
  case 0x60:
  case 0x61:
    goto switchD_00194bde_caseD_15;
  case 0x18:
  case 0x5c:
switchD_00194bde_caseD_18:
    iVar8 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    break;
  case 0x25:
    iVar8 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    cVar5 = sqlite3AffinityType((pExpr->u).zToken);
    if (iVar8 != target) {
      sqlite3VdbeAddOp3(pVVar22,0xf,iVar8,target,0);
      iVar8 = target;
    }
    sqlite3VdbeAddOp3(pVVar22,cVar5 + 0x2c,iVar8,0,0);
    sqlite3ExprCacheRemove(pParse,iVar8,1);
    break;
  case 0x38:
    if (pParse->pTriggerTab == (Table *)0x0) {
      sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
      return 0;
    }
    cVar5 = pExpr->affinity;
    if (cVar5 != '\x04') {
      if (cVar5 == '\x02') {
        pPVar11 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar11 = pParse;
        }
        pPVar11->mayAbort = '\x01';
      }
      sqlite3HaltConstraint(pParse,0x713,(int)cVar5,(pExpr->u).zToken,0);
      break;
    }
    pcVar12 = (pExpr->u).zToken;
    iVar6 = 6;
    iVar9 = 4;
    goto LAB_00194f6c;
  case 0x3c:
    pTVar1 = pExpr->pTab;
    sqlite3VdbeAddOp3(pVVar22,0x74,(int)pExpr->iColumn + (pTVar1->nCol + 1) * pExpr->iTable + 1,
                      target,0);
    if (((long)pExpr->iColumn < 0) || (pTVar1->aCol[pExpr->iColumn].affinity != 'e')) break;
    uVar10 = 0x16;
    iVar9 = 0;
    iVar7 = target;
    goto LAB_00194fca;
  case 0x44:
  case 0x45:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
    iVar9 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar7 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    goto LAB_00194fcd;
  case 0x46:
switchD_00194bde_caseD_46:
    iVar9 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar6 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    uVar10 = (uVar10 == 0x46) + 0x4b;
    pEVar18 = pExpr->pLeft;
    pEVar16 = pExpr->pRight;
    iVar7 = 0x90;
    goto LAB_00194d9a;
  case 0x47:
    local_100 = pExpr->pLeft;
    pEVar13 = ((pExpr->x).pList)->a;
    pEVar18 = pEVar13->pExpr;
    iVar9 = sqlite3ExprCodeTemp(pParse,local_100,&regFree1);
    local_108 = (Parse *)CONCAT44(local_108._4_4_,iVar9);
    iVar9 = sqlite3ExprCodeTemp(pParse,pEVar18,&regFree2);
    if (pParse->nTempReg == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
    }
    else {
      bVar14 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar14;
      iVar6 = pParse->aTempReg[bVar14];
    }
    if (pParse->nTempReg == '\0') {
      iVar7 = pParse->nMem + 1;
      pParse->nMem = iVar7;
    }
    else {
      bVar14 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar14;
      iVar7 = pParse->aTempReg[bVar14];
    }
    codeCompare(pParse,local_100,pEVar18,0x50,(uint)local_108,iVar9,iVar6,0x10);
    pEVar18 = pEVar13[1].pExpr;
    if (regFree2 != 0) {
      bVar14 = pParse->nTempReg;
      if ((ulong)bVar14 < 8) {
        lVar17 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar17) == regFree2) {
            (&pParse->aColCache[0].tempReg)[lVar17] = '\x01';
            goto LAB_0019576b;
          }
          lVar17 = lVar17 + 0x18;
        } while ((int)lVar17 != 0xf0);
        pParse->nTempReg = bVar14 + 1;
        pParse->aTempReg[bVar14] = regFree2;
      }
    }
LAB_0019576b:
    iVar9 = sqlite3ExprCodeTemp(pParse,pEVar18,&regFree2);
    codeCompare(pParse,local_100,pEVar18,0x4e,(uint)local_108,iVar9,iVar7,0x10);
    sqlite3VdbeAddOp3(local_f8,0x45,iVar6,iVar7,target);
    if (iVar6 != 0) {
      bVar14 = pParse->nTempReg;
      if ((ulong)bVar14 < 8) {
        lVar17 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar17) == iVar6) {
            (&pParse->aColCache[0].tempReg)[lVar17] = '\x01';
            goto LAB_001957f1;
          }
          lVar17 = lVar17 + 0x18;
        } while ((int)lVar17 != 0xf0);
        pParse->nTempReg = bVar14 + 1;
        pParse->aTempReg[bVar14] = iVar6;
      }
    }
LAB_001957f1:
    if (iVar7 != 0) {
      bVar14 = pParse->nTempReg;
      if ((ulong)bVar14 < 8) {
        lVar17 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar17) == iVar7) {
            (&pParse->aColCache[0].tempReg)[lVar17] = '\x01';
            goto LAB_00194fd5;
          }
          lVar17 = lVar17 + 0x18;
        } while ((int)lVar17 != 0xf0);
        pParse->nTempReg = bVar14 + 1;
        pParse->aTempReg[bVar14] = iVar7;
      }
    }
    break;
  case 0x48:
    uVar10 = sqlite3VdbeMakeLabel(pVVar22);
    destIfNull = sqlite3VdbeMakeLabel(pVVar22);
    sqlite3VdbeAddOp3(pVVar22,10,0,target,0);
    sqlite3ExprCodeIN(pParse,pExpr,uVar10,destIfNull);
    sqlite3VdbeAddOp3(pVVar22,7,1,target,0);
    if (pVVar22->aLabel != (int *)0x0) {
      pVVar22->aLabel[(int)~uVar10] = pVVar22->nOp;
    }
    sqlite3VdbeAddOp3(pVVar22,0x14,target,0,0);
    if (pVVar22->aLabel != (int *)0x0) {
      pVVar22->aLabel[(int)~destIfNull] = pVVar22->nOp;
    }
    break;
  case 0x49:
  case 0x4a:
    sqlite3VdbeAddOp3(pVVar22,7,1,target,0);
    iVar9 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    uVar10 = sqlite3VdbeAddOp3(pVVar22,uVar10,iVar9,0,0);
    sqlite3VdbeAddOp3(pVVar22,0x14,target,-1,0);
    if ((-1 < (int)uVar10) && (uVar10 < (uint)pVVar22->nOp)) {
      pVVar22->aOp[uVar10].p2 = pVVar22->nOp;
    }
    break;
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
    iVar9 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar6 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    pEVar18 = pExpr->pLeft;
    pEVar16 = pExpr->pRight;
    iVar7 = 0x10;
LAB_00194d9a:
    codeCompare(pParse,pEVar18,pEVar16,uVar10,iVar9,iVar6,target,iVar7);
    break;
  case 0x5e:
    pcVar12 = (pExpr->u).zToken;
    iVar6 = 0x5e;
LAB_00194f6c:
    iVar9 = sqlite3VdbeAddOp3(pVVar22,iVar6,0,iVar9,0);
    iVar6 = 0;
LAB_00195142:
    sqlite3VdbeChangeP4(pVVar22,iVar9,pcVar12,iVar6);
    break;
  case 0x62:
    uVar10 = 10;
    iVar7 = 0;
LAB_00194fca:
    iVar6 = 0;
LAB_00194fcd:
    sqlite3VdbeAddOp3(pVVar22,uVar10,iVar7,iVar9,iVar6);
    break;
  default:
    switch(uVar10) {
    case 0x81:
      iVar9 = 0;
      goto LAB_00195274;
    case 0x82:
      pcVar12 = (pExpr->u).zToken;
      iVar9 = 0;
LAB_0019565f:
      codeReal(pVVar22,pcVar12,iVar9,target);
      break;
    case 0x83:
      uVar10 = 0xffffffff;
      pcVar12 = (pExpr->u).zToken + 2;
      do {
        uVar10 = uVar10 + 1;
        cVar5 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while (cVar5 != '\0');
      iVar9 = (uVar10 & 0x3fffffff) - 1;
      pcVar12 = (char *)sqlite3HexToBlob(pVVar22->db,(pExpr->u).zToken + 2,iVar9);
      iVar9 = sqlite3VdbeAddOp3(pVVar22,0xb,
                                (int)(((uVar10 & 0x3fffffff) - (iVar9 >> 0x1f)) + -1) >> 1,target,0)
      ;
      sqlite3VdbeChangeP4(pVVar22,iVar9,pcVar12,-1);
      break;
    case 0x84:
      iVar8 = pExpr->iTable;
      break;
    case 0x85:
      sqlite3VdbeAddOp3(pVVar22,0xc,(int)pExpr->iColumn,target,0);
      if ((pExpr->u).zToken[1] == '\0') break;
      pcVar12 = pParse->azVar[(long)pExpr->iColumn + -1];
      iVar9 = -1;
      iVar6 = -2;
      goto LAB_00195142;
    case 0x92:
      goto switchD_00194bde_caseD_46;
    case 0x97:
    case 0x9b:
      local_e0 = pParse->db;
      local_f0 = 0;
      if ((pExpr->flags & 0x4000) == 0) {
        local_100 = (Expr *)(pExpr->x).pList;
      }
      else {
        local_100 = (Expr *)0x0;
      }
      if (local_100 != (Expr *)0x0) {
        local_f0 = (ulong)(uint)((ExprList *)local_100)->nExpr;
      }
      pcVar12 = (pExpr->u).zToken;
      if (pcVar12 == (char *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0xffffffff;
        pcVar15 = pcVar12;
        do {
          uVar10 = uVar10 + 1;
          cVar5 = *pcVar15;
          pcVar15 = pcVar15 + 1;
        } while (cVar5 != '\0');
        uVar10 = uVar10 & 0x3fffffff;
      }
      pDef = sqlite3FindFunction(local_e0,pcVar12,uVar10,(int)local_f0,local_e0->aDb->pSchema->enc,
                                 '\0');
      uVar21 = local_f0;
      pVVar22 = local_f8;
      pEVar18 = local_100;
      if (pDef == (FuncDef *)0x0) {
        sqlite3ErrorMsg(pParse,"unknown function: %.*s()",(ulong)uVar10,pcVar12);
        break;
      }
      bVar14 = pDef->flags;
      if ((bVar14 & 0x20) != 0) {
        iVar9 = sqlite3VdbeMakeLabel(local_f8);
        pEVar18 = local_100;
        local_108 = (Parse *)CONCAT44(local_108._4_4_,iVar9);
        sqlite3ExprCode(pParse,(*(ExprList_item **)&local_100->u)->pExpr,target);
        if (1 < (int)local_f0) {
          uVar21 = local_f0 & 0xffffffff;
          lVar17 = 0x20;
          do {
            sqlite3VdbeAddOp3(pVVar22,0x4a,target,(uint)local_108,0);
            sqlite3ExprCacheRemove(pParse,target,1);
            pParse->iCacheLevel = pParse->iCacheLevel + 1;
            pEVar16 = *(Expr **)((long)&(*(ExprList_item **)&pEVar18->u)->pExpr + lVar17);
            sqlite3ExprCode(pParse,pEVar16,target);
            sqlite3ExprCachePop(pParse,(int)pEVar16);
            lVar17 = lVar17 + 0x20;
          } while (uVar21 << 5 != lVar17);
        }
        if (pVVar22->aLabel != (int *)0x0) {
          pVVar22->aLabel[(int)~(uint)local_108] = pVVar22->nOp;
        }
        break;
      }
      iVar9 = (int)local_f0;
      if (local_100 == (Expr *)0x0) {
        local_e8 = (Expr *)0x0;
      }
      else {
        if (pParse->nRangeReg < iVar9) {
          uVar10 = pParse->nMem + 1;
          pParse->nMem = pParse->nMem + iVar9;
        }
        else {
          uVar10 = pParse->iRangeReg;
          pParse->iRangeReg = uVar10 + iVar9;
          pParse->nRangeReg = pParse->nRangeReg - iVar9;
        }
        local_e8 = (Expr *)(ulong)uVar10;
        if ((0x3f < bVar14) &&
           (pEVar16 = (*(ExprList_item **)&local_100->u)->pExpr, (pEVar16->op & 0xfd) == 0x98)) {
          pEVar16->op2 = bVar14;
        }
        pParse->iCacheLevel = pParse->iCacheLevel + 1;
        pEVar16 = local_100;
        sqlite3ExprCodeExprList(pParse,(ExprList *)local_100,uVar10,1);
        sqlite3ExprCachePop(pParse,(int)pEVar16);
      }
      if ((iVar9 < 2) || ((pExpr->flags & 0x80) == 0)) {
        if (0 < iVar9) {
          pEVar13 = *(ExprList_item **)&pEVar18->u;
          goto LAB_00195842;
        }
      }
      else {
        pEVar13 = *(ExprList_item **)&pEVar18->u + 1;
LAB_00195842:
        pDef = sqlite3VtabOverloadFunction(local_e0,pDef,iVar9,pEVar13->pExpr);
      }
      if (iVar9 < 1) {
        zP4 = (CollSeq *)0x0;
        local_108 = (Parse *)((ulong)local_108._4_4_ << 0x20);
      }
      else {
        uVar20 = 0;
        local_108 = (Parse *)((ulong)local_108._4_4_ << 0x20);
        zP4 = (CollSeq *)0x0;
        do {
          if (uVar20 < 0x20) {
            opCompare.pLeft = (Expr *)0x0;
            opCompare.pRight = (Expr *)0x0;
            opCompare.x = (anon_union_8_2_a01b6dbf_for_x)0x1;
            opCompare._0_8_ = exprNodeIsConstant;
            opCompare.u.zToken = (char *)selectNodeIsConstant;
            sqlite3WalkExpr((Walker *)&opCompare,(*(ExprList_item **)&local_100->u)[uVar20].pExpr);
            if (opCompare.x._0_4_ != 0) {
              local_108 = (Parse *)CONCAT44(local_108._4_4_,
                                            (uint)local_108 | 1 << ((uint)uVar20 & 0x1f));
            }
          }
          if (((pDef->flags & 8) != 0) && (zP4 == (CollSeq *)0x0)) {
            zP4 = sqlite3ExprCollSeq(pParse,(*(ExprList_item **)&local_100->u)[uVar20].pExpr);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != (uVar21 & 0xffffffff));
      }
      uVar21 = local_f0;
      pVVar22 = local_f8;
      if ((pDef->flags & 8) != 0) {
        if (zP4 == (CollSeq *)0x0) {
          zP4 = local_e0->pDfltColl;
        }
        iVar9 = sqlite3VdbeAddOp3(local_f8,0x11,0,0,0);
        sqlite3VdbeChangeP4(pVVar22,iVar9,(char *)zP4,-4);
      }
      iVar6 = (int)local_e8;
      iVar9 = sqlite3VdbeAddOp3(pVVar22,0x12,(uint)local_108,iVar6,target);
      sqlite3VdbeChangeP4(pVVar22,iVar9,(char *)pDef,-5);
      if (pVVar22->aOp != (Op *)0x0) {
        pVVar22->aOp[(long)pVVar22->nOp + -1].p5 = (u8)uVar21;
      }
      iVar9 = (int)uVar21;
      if ((iVar9 != 0) && (sqlite3ExprCacheRemove(pParse,iVar6,iVar9), pParse->nRangeReg < iVar9)) {
        pParse->nRangeReg = iVar9;
        pParse->iRangeReg = iVar6;
      }
      break;
    case 0x98:
      goto switchD_00194c36_caseD_98;
    case 0x99:
      if (pExpr->pAggInfo == (AggInfo *)0x0) {
        sqlite3ErrorMsg(pParse,"misuse of aggregate: %s()",(pExpr->u).zToken);
      }
      else {
        iVar8 = pExpr->pAggInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    case 0x9a:
      pAVar2 = pExpr->pAggInfo;
      if (pAVar2->directMode == '\0') {
        bVar23 = false;
        iVar8 = pAVar2->aCol[pExpr->iAgg].iMem;
      }
      else {
        bVar23 = pAVar2->useSortingIdx == '\0';
        if (!bVar23) {
          sqlite3VdbeAddOp3(pVVar22,0x1d,pAVar2->sortingIdxPTab,
                            pAVar2->aCol[pExpr->iAgg].iSorterColumn,target);
        }
      }
      if (!bVar23) break;
      goto switchD_00194c36_caseD_98;
    case 0x9c:
      pEVar18 = pExpr->pLeft;
      if (pEVar18->op == 0x82) {
        pcVar12 = (pEVar18->u).zToken;
        iVar9 = 1;
        goto LAB_0019565f;
      }
      if (pEVar18->op != 0x81) {
        if (pParse->nTempReg == '\0') {
          iVar9 = pParse->nMem + 1;
          pParse->nMem = iVar9;
        }
        else {
          bVar14 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar14;
          iVar9 = pParse->aTempReg[bVar14];
        }
        regFree1 = iVar9;
        sqlite3VdbeAddOp3(pVVar22,7,0,iVar9,0);
        iVar7 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree2);
        uVar10 = 0x57;
        goto LAB_00194fcd;
      }
      iVar9 = 1;
      pExpr = pEVar18;
LAB_00195274:
      codeInteger(pParse,pExpr,iVar9,target);
      break;
    case 0x9d:
      goto switchD_00194bde_caseD_18;
    default:
      if (uVar10 == 0x74) goto switchD_00194bde_caseD_14;
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
    case 0x90:
    case 0x91:
    case 0x93:
    case 0x94:
    case 0x95:
    case 0x96:
switchD_00194bde_caseD_15:
      pEVar13 = ((pExpr->x).pList)->a;
      local_f0 = CONCAT44(local_f0._4_4_,((pExpr->x).pList)->nExpr);
      iVar9 = sqlite3VdbeMakeLabel(pVVar22);
      local_e0 = (sqlite3 *)CONCAT44(local_e0._4_4_,iVar9);
      pEVar18 = pExpr->pLeft;
      local_108 = pParse;
      local_d8 = (ulong)(uint)target;
      if (pEVar18 == (Expr *)0x0) {
        pEVar16 = (Expr *)0x0;
      }
      else {
        opCompare.pLeft = &cacheX;
        pEVar16 = pEVar18;
        pEVar19 = opCompare.pLeft;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          cVar5 = pEVar16->affinity;
          uVar3 = pEVar16->flags;
          uVar4 = *(undefined4 *)&pEVar16->field_0x4;
          pEVar19->op = pEVar16->op;
          pEVar19->affinity = cVar5;
          pEVar19->flags = uVar3;
          *(undefined4 *)&pEVar19->field_0x4 = uVar4;
          pEVar16 = (Expr *)((long)pEVar16 + (ulong)bVar14 * -0x10 + 8);
          pEVar19 = (Expr *)((long)pEVar19 + (ulong)bVar14 * -0x10 + 8);
        }
        cacheX.iTable = sqlite3ExprCodeTemp(pParse,pEVar18,&regFree1);
        cacheX.op = 0x84;
        pEVar16 = &opCompare;
        opCompare.op = 'L';
        regFree1 = 0;
      }
      if (0 < (int)local_f0) {
        pEVar13 = pEVar13 + 1;
        iVar9 = 0;
        local_e8 = pEVar18;
        local_d0 = pExpr;
        do {
          pVVar22 = local_f8;
          local_108->iCacheLevel = local_108->iCacheLevel + 1;
          pEVar18 = pEVar13[-1].pExpr;
          if (local_e8 != (Expr *)0x0) {
            pEVar18 = pEVar16;
            opCompare.pRight = pEVar13[-1].pExpr;
          }
          pEVar16 = pEVar18;
          local_100 = (Expr *)pEVar13;
          uVar10 = sqlite3VdbeMakeLabel(local_f8);
          pPVar11 = local_108;
          sqlite3ExprIfFalse(local_108,pEVar16,uVar10,8);
          sqlite3ExprCode(pPVar11,*(Expr **)&local_100->op,(int)local_d8);
          iVar8 = 1;
          sqlite3VdbeAddOp3(pVVar22,1,0,(uint)local_e0,0);
          sqlite3ExprCachePop(pPVar11,iVar8);
          if (pVVar22->aLabel != (int *)0x0) {
            pVVar22->aLabel[(int)~uVar10] = pVVar22->nOp;
          }
          pEVar13 = (ExprList_item *)((long)local_100 + 0x40);
          iVar9 = iVar9 + 2;
          pExpr = local_d0;
        } while (iVar9 < (int)local_f0);
      }
      pVVar22 = local_f8;
      pPVar11 = local_108;
      pEVar18 = pExpr->pRight;
      iVar8 = (int)local_d8;
      if (pEVar18 == (Expr *)0x0) {
        sqlite3VdbeAddOp3(local_f8,10,0,iVar8,0);
      }
      else {
        local_108->iCacheLevel = local_108->iCacheLevel + 1;
        sqlite3ExprCode(local_108,pEVar18,iVar8);
        sqlite3ExprCachePop(pPVar11,(int)pEVar18);
        local_108 = pPVar11;
        pVVar22 = local_f8;
      }
      pParse = local_108;
      if (pVVar22->aLabel != (int *)0x0) {
        pVVar22->aLabel[(int)~(uint)local_e0] = pVVar22->nOp;
      }
    }
  }
LAB_00194fd5:
  if (regFree1 != 0) {
    bVar14 = pParse->nTempReg;
    if ((ulong)bVar14 < 8) {
      lVar17 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar17) == regFree1) {
          (&pParse->aColCache[0].tempReg)[lVar17] = '\x01';
          goto LAB_0019500f;
        }
        lVar17 = lVar17 + 0x18;
      } while ((int)lVar17 != 0xf0);
      pParse->nTempReg = bVar14 + 1;
      pParse->aTempReg[bVar14] = regFree1;
    }
  }
LAB_0019500f:
  if (regFree2 != 0) {
    bVar14 = pParse->nTempReg;
    if ((ulong)bVar14 < 8) {
      lVar17 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar17) == regFree2) {
          (&pParse->aColCache[0].tempReg)[lVar17] = '\x01';
          return iVar8;
        }
        lVar17 = lVar17 + 0x18;
      } while ((int)lVar17 != 0xf0);
      pParse->nTempReg = bVar14 + 1;
      pParse->aTempReg[bVar14] = regFree2;
    }
  }
  return iVar8;
switchD_00194c36_caseD_98:
  if (pExpr->iTable < 0) {
    iVar8 = (int)pExpr->iColumn + pParse->ckBase;
  }
  else {
    iVar8 = sqlite3ExprCodeGetColumn
                      (pParse,pExpr->pTab,(int)pExpr->iColumn,pExpr->iTable,target,pExpr->op2);
  }
  goto LAB_00194fd5;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2, r3, r4;       /* Various register numbers */
  sqlite3 *db = pParse->db; /* The database connection */

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        inReg = pCol->iMem;
        break;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        break;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      if( pExpr->iTable<0 ){
        /* This only happens when coding check constraints */
        assert( pParse->ckBase>0 );
        inReg = pExpr->iColumn + pParse->ckBase;
      }else{
        inReg = sqlite3ExprCodeGetColumn(pParse, pExpr->pTab,
                                 pExpr->iColumn, pExpr->iTable, target,
                                 pExpr->op2);
      }
      break;
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      break;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      break;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeAddOp4(v, OP_String8, 0, target, 0, pExpr->u.zToken, 0);
      break;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      break;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      break;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        assert( pExpr->u.zToken[0]=='?' 
             || strcmp(pExpr->u.zToken, pParse->azVar[pExpr->iColumn-1])==0 );
        sqlite3VdbeChangeP4(v, -1, pParse->azVar[pExpr->iColumn-1], P4_STATIC);
      }
      break;
    }
    case TK_REGISTER: {
      inReg = pExpr->iTable;
      break;
    }
    case TK_AS: {
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      break;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      int aff, to_op;
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      aff = sqlite3AffinityType(pExpr->u.zToken);
      to_op = aff - SQLITE_AFF_TEXT + OP_ToText;
      assert( to_op==OP_ToText    || aff!=SQLITE_AFF_TEXT    );
      assert( to_op==OP_ToBlob    || aff!=SQLITE_AFF_NONE    );
      assert( to_op==OP_ToNumeric || aff!=SQLITE_AFF_NUMERIC );
      assert( to_op==OP_ToInt     || aff!=SQLITE_AFF_INTEGER );
      assert( to_op==OP_ToReal    || aff!=SQLITE_AFF_REAL    );
      testcase( to_op==OP_ToText );
      testcase( to_op==OP_ToBlob );
      testcase( to_op==OP_ToNumeric );
      testcase( to_op==OP_ToInt );
      testcase( to_op==OP_ToReal );
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp1(v, to_op, inReg);
      testcase( usedAsColumnCache(pParse, inReg, inReg) );
      sqlite3ExprCacheAffinityChange(pParse, inReg, 1);
      break;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      assert( TK_LT==OP_Lt );
      assert( TK_LE==OP_Le );
      assert( TK_GT==OP_Gt );
      assert( TK_GE==OP_Ge );
      assert( TK_EQ==OP_Eq );
      assert( TK_NE==OP_Ne );
      testcase( op==TK_LT );
      testcase( op==TK_LE );
      testcase( op==TK_GT );
      testcase( op==TK_GE );
      testcase( op==TK_EQ );
      testcase( op==TK_NE );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, inReg, SQLITE_STOREP2);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      testcase( op==TK_IS );
      testcase( op==TK_ISNOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, inReg, SQLITE_STOREP2 | SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );
      assert( TK_OR==OP_Or );
      assert( TK_PLUS==OP_Add );
      assert( TK_MINUS==OP_Subtract );
      assert( TK_REM==OP_Remainder );
      assert( TK_BITAND==OP_BitAnd );
      assert( TK_BITOR==OP_BitOr );
      assert( TK_SLASH==OP_Divide );
      assert( TK_LSHIFT==OP_ShiftLeft );
      assert( TK_RSHIFT==OP_ShiftRight );
      assert( TK_CONCAT==OP_Concat );
      testcase( op==TK_AND );
      testcase( op==TK_OR );
      testcase( op==TK_PLUS );
      testcase( op==TK_MINUS );
      testcase( op==TK_REM );
      testcase( op==TK_BITAND );
      testcase( op==TK_BITOR );
      testcase( op==TK_SLASH );
      testcase( op==TK_LSHIFT );
      testcase( op==TK_RSHIFT );
      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
#endif
      }else{
        regFree1 = r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, r1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      inReg = target;
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );
      assert( TK_NOT==OP_Not );
      testcase( op==TK_BITNOT );
      testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      inReg = target;
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );
      assert( TK_NOTNULL==OP_NotNull );
      testcase( op==TK_ISNULL );
      testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, -1);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        inReg = pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_CONST_FUNC:
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      int nId;               /* Length of the function name in bytes */
      const char *zId;       /* The function name */
      int constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      testcase( op==TK_CONST_FUNC );
      testcase( op==TK_FUNCTION );
      if( ExprHasAnyProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(db, zId, nId, nFarg, enc, 0);
      if( pDef==0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %.*s()", nId, zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evalation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->flags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(v);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          sqlite3ExprCacheRemove(pParse, target, 1);
          sqlite3ExprCachePush(pParse);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
          sqlite3ExprCachePop(pParse, 1);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }


      if( pFarg ){
        r1 = sqlite3GetTempRange(pParse, nFarg);

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->flags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->flags==SQLITE_FUNC_LENGTH );
            pFarg->a[0].pExpr->op2 = pDef->flags;
          }
        }

        sqlite3ExprCachePush(pParse);     /* Ticket 2ea2425d34be */
        sqlite3ExprCodeExprList(pParse, pFarg, r1, 1);
        sqlite3ExprCachePop(pParse, 1);   /* Ticket 2ea2425d34be */
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && (pExpr->flags & EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          constMask |= (1<<i);
        }
        if( (pDef->flags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pDef->flags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp4(v, OP_Function, constMask, r1, target,
                        (char*)pDef, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nFarg);
      if( nFarg ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      inReg = sqlite3CodeSubselect(pParse, pExpr, 0, 0);
      break;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(v);
      int destIfNull = sqlite3VdbeMakeLabel(v);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      break;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      Expr *pLeft = pExpr->pLeft;
      struct ExprList_item *pLItem = pExpr->x.pList->a;
      Expr *pRight = pLItem->pExpr;

      r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pRight, &regFree2);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      r3 = sqlite3GetTempReg(pParse);
      r4 = sqlite3GetTempReg(pParse);
      codeCompare(pParse, pLeft, pRight, OP_Ge,
                  r1, r2, r3, SQLITE_STOREP2);
      pLItem++;
      pRight = pLItem->pExpr;
      sqlite3ReleaseTempReg(pParse, regFree2);
      r2 = sqlite3ExprCodeTemp(pParse, pRight, &regFree2);
      testcase( regFree2==0 );
      codeCompare(pParse, pLeft, pRight, OP_Le, r1, r2, r4, SQLITE_STOREP2);
      sqlite3VdbeAddOp3(v, OP_And, r3, r4, target);
      sqlite3ReleaseTempReg(pParse, r3);
      sqlite3ReleaseTempReg(pParse, r4);
      break;
    }
    case TK_COLLATE: 
    case TK_UPLUS: {
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      break;
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "%s.%s -> $%d",
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->pTab->aCol[pExpr->iColumn].zName),
        target
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }


    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in pExpr->pRight.  The Y is also optional.  If there is no
    ** ELSE clause and no other term matches, then the result of the
    ** exprssion is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr cacheX;                      /* Cached expression X */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */
      VVA_ONLY( int iCacheLevel = pParse->iCacheLevel; )

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert((pExpr->x.pList->nExpr % 2) == 0);
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(v);
      if( (pX = pExpr->pLeft)!=0 ){
        cacheX = *pX;
        testcase( pX->op==TK_COLUMN );
        testcase( pX->op==TK_REGISTER );
        cacheX.iTable = sqlite3ExprCodeTemp(pParse, pX, &regFree1);
        testcase( regFree1==0 );
        cacheX.op = TK_REGISTER;
        opCompare.op = TK_EQ;
        opCompare.pLeft = &cacheX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr; i=i+2){
        sqlite3ExprCachePush(pParse);
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(v);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        testcase( aListelem[i+1].pExpr->op==TK_REGISTER );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, endLabel);
        sqlite3ExprCachePop(pParse, 1);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( pExpr->pRight ){
        sqlite3ExprCachePush(pParse);
        sqlite3ExprCode(pParse, pExpr->pRight, target);
        sqlite3ExprCachePop(pParse, 1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      assert( db->mallocFailed || pParse->nErr>0 
           || pParse->iCacheLevel==iCacheLevel );
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}